

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionStats::SectionStats
          (SectionStats *this,SectionInfo *_sectionInfo,Counts *_assertions,
          double _durationInSeconds,bool _missingAssertions)

{
  byte in_CL;
  SectionInfo *in_RDX;
  SectionInfo *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  
  *in_RDI = &PTR__SectionStats_0021d948;
  SectionInfo::SectionInfo(in_RSI,in_RDX);
  in_RDI[0xe] = *(undefined8 *)in_RDX;
  in_RDI[0xf] = *(undefined8 *)&in_RDX->field_0x8;
  in_RDI[0x10] = *(undefined8 *)&in_RDX->field_0x10;
  in_RDI[0x11] = in_XMM0_Qa;
  *(byte *)(in_RDI + 0x12) = in_CL & 1;
  return;
}

Assistant:

SectionStats(   SectionInfo const& _sectionInfo,
                        Counts const& _assertions,
                        double _durationInSeconds,
                        bool _missingAssertions )
        :   sectionInfo( _sectionInfo ),
            assertions( _assertions ),
            durationInSeconds( _durationInSeconds ),
            missingAssertions( _missingAssertions )
        {}